

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void H3_verify(picnic_instance_t *pp,sig_proof_t *prf,picnic_context_t *context,uint8_t *ch)

{
  byte bVar1;
  uint uVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint8_t hash [64];
  uint i_2;
  uint with_input_bytes_size;
  uint without_input_bytes_size;
  uint i_1;
  uint i;
  proof_round_t *round;
  hash_context ctx;
  uint input_output_size;
  uint num_rounds;
  uint digest_size;
  undefined4 in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  uint in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  picnic_instance_t *in_stack_fffffffffffffe88;
  hash_context *in_stack_fffffffffffffe90;
  uint local_12c;
  uint local_120;
  uint local_11c;
  uint8_t *in_stack_ffffffffffffff70;
  uint8_t *in_stack_ffffffffffffff78;
  picnic_instance_t *in_stack_ffffffffffffff80;
  
  uVar2 = (uint)*(ushort *)(in_RDI + 4);
  hash_init_prefix((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),'\0');
  for (local_11c = 0; local_11c < uVar2; local_11c = local_11c + 1) {
    bVar1 = *(byte *)(*(long *)(in_RSI + 0x20) + (ulong)local_11c);
    in_stack_fffffffffffffe84 = (uint)bVar1;
    if (in_stack_fffffffffffffe84 == 0) {
      hash_update((hash_context *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bc2a)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bc46)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bc62)
      ;
    }
    else if (in_stack_fffffffffffffe84 == 1) {
      hash_update((hash_context *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bc83)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bc9f)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bcbb)
      ;
    }
    else {
      hash_update((hash_context *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bcd9)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bcf5)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bd11)
      ;
    }
  }
  for (local_120 = 0; local_120 < uVar2; local_120 = local_120 + 1) {
    in_stack_fffffffffffffe80 = (uint)*(byte *)(*(long *)(in_RSI + 0x20) + (ulong)local_120);
    if (in_stack_fffffffffffffe80 == 0) {
      hash_update((hash_context *)((ulong)in_stack_fffffffffffffe84 << 0x20),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bda5)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bdc1)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bddd)
      ;
    }
    else if (in_stack_fffffffffffffe80 == 1) {
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,1),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13bdfe)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13be1a)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13be36)
      ;
    }
    else {
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13be54)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13be70)
      ;
      hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13be8c)
      ;
    }
  }
  if ((*(byte *)(in_RDX + 0x68) & 1) != 0) {
    for (local_12c = 0; local_12c < uVar2; local_12c = local_12c + 1) {
      bVar1 = *(byte *)(*(long *)(in_RSI + 0x20) + (ulong)local_12c);
      in_stack_fffffffffffffe7c = (uint)bVar1;
      if (in_stack_fffffffffffffe7c == 0) {
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe78),0x13bf55);
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    0x13bf71);
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    0x13bf8d);
      }
      else if (in_stack_fffffffffffffe7c == 1) {
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe78),0x13bfae);
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    0x13bfc7);
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    0x13bfe3);
      }
      else {
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe78),0x13c001);
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    0x13c01d);
        hash_update((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    0x13c036);
      }
    }
  }
  H3_public_key_message
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (uint8_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (picnic_context_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  hash_final((hash_context *)0x13c086);
  memset(&stack0xfffffffffffffe88,0,0x40);
  hash_squeeze((hash_context *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (uint8_t *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0x13c0af);
  H3_compute(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  return;
}

Assistant:

static void H3_verify(const picnic_instance_t* pp, sig_proof_t* prf,
                      const picnic_context_t* context, uint8_t* ch) {
  const unsigned int digest_size       = pp->digest_size;
  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;

  hash_context ctx;
  hash_init_prefix(&ctx, digest_size, HASH_PREFIX_1);

  // hash output shares
  proof_round_t* round = prf->round;
  for (unsigned int i = 0; i < num_rounds; ++i, ++round) {
    switch (prf->challenge[i]) {
    case 0: {
      hash_update(&ctx, round->output_shares[0], input_output_size);
      hash_update(&ctx, round->output_shares[1], input_output_size);
      hash_update(&ctx, round->output_shares[2], input_output_size);
      break;
    }
    case 1: {
      hash_update(&ctx, round->output_shares[2], input_output_size);
      hash_update(&ctx, round->output_shares[0], input_output_size);
      hash_update(&ctx, round->output_shares[1], input_output_size);
      break;
    }
    default: {
      hash_update(&ctx, round->output_shares[1], input_output_size);
      hash_update(&ctx, round->output_shares[2], input_output_size);
      hash_update(&ctx, round->output_shares[0], input_output_size);
      break;
    }
    }
  }

  // hash commitments
  round = prf->round;
  for (unsigned int i = 0; i < num_rounds; ++i, ++round) {
    switch (prf->challenge[i]) {
    case 0: {
      hash_update(&ctx, round->commitments[0], digest_size);
      hash_update(&ctx, round->commitments[1], digest_size);
      hash_update(&ctx, round->commitments[2], digest_size);
      break;
    }
    case 1: {
      hash_update(&ctx, round->commitments[2], digest_size);
      hash_update(&ctx, round->commitments[0], digest_size);
      hash_update(&ctx, round->commitments[1], digest_size);
      break;
    }
    default: {
      hash_update(&ctx, round->commitments[1], digest_size);
      hash_update(&ctx, round->commitments[2], digest_size);
      hash_update(&ctx, round->commitments[0], digest_size);
      break;
    }
    }
  }

#if defined(WITH_UNRUH)
  if (context->unruh) {
    const unsigned int without_input_bytes_size = pp->view_size + input_output_size;
    const unsigned int with_input_bytes_size    = without_input_bytes_size + input_output_size;

    // hash commitments
    round = prf->round;
    for (unsigned int i = 0; i < num_rounds; ++i, ++round) {
      switch (prf->challenge[i]) {
      case 0: {
        hash_update(&ctx, round->gs[0], without_input_bytes_size);
        hash_update(&ctx, round->gs[1], without_input_bytes_size);
        hash_update(&ctx, round->gs[2], with_input_bytes_size);
        break;
      }
      case 1: {
        hash_update(&ctx, round->gs[2], without_input_bytes_size);
        hash_update(&ctx, round->gs[0], without_input_bytes_size);
        hash_update(&ctx, round->gs[1], with_input_bytes_size);
        break;
      }
      default: {
        hash_update(&ctx, round->gs[1], without_input_bytes_size);
        hash_update(&ctx, round->gs[2], without_input_bytes_size);
        hash_update(&ctx, round->gs[0], with_input_bytes_size);
        break;
      }
      }
    }
  }
#endif

  // hash public key, salt, and message
  H3_public_key_message(&ctx, pp, prf->salt, context);
  hash_final(&ctx);

  uint8_t hash[MAX_DIGEST_SIZE] = {0};
  hash_squeeze(&ctx, hash, digest_size);
  hash_clear(&ctx);
  H3_compute(pp, hash, ch);
}